

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_add_hs_hdr_to_checksum(mbedtls_ssl_context *ssl,uint hs_type,size_t total_hs_len)

{
  int iVar1;
  uchar local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  size_t sStack_20;
  uchar hs_hdr [4];
  size_t total_hs_len_local;
  uint hs_type_local;
  mbedtls_ssl_context *ssl_local;
  
  local_24 = (uchar)hs_type;
  local_23 = (undefined1)(total_hs_len >> 0x10);
  local_22 = (undefined1)(total_hs_len >> 8);
  local_21 = (undefined1)total_hs_len;
  sStack_20 = total_hs_len;
  iVar1 = (*ssl->handshake->update_checksum)(ssl,&local_24,4);
  return iVar1;
}

Assistant:

int mbedtls_ssl_add_hs_hdr_to_checksum(mbedtls_ssl_context *ssl,
                                       unsigned hs_type,
                                       size_t total_hs_len)
{
    unsigned char hs_hdr[4];

    /* Build HS header for checksum update. */
    hs_hdr[0] = MBEDTLS_BYTE_0(hs_type);
    hs_hdr[1] = MBEDTLS_BYTE_2(total_hs_len);
    hs_hdr[2] = MBEDTLS_BYTE_1(total_hs_len);
    hs_hdr[3] = MBEDTLS_BYTE_0(total_hs_len);

    return ssl->handshake->update_checksum(ssl, hs_hdr, sizeof(hs_hdr));
}